

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::process_restart(jpeg_decoder *this)

{
  uint uVar1;
  jpeg_decoder *in_RDI;
  int c;
  int i;
  jpgd_status status;
  uint uVar2;
  int num_bits;
  jpeg_decoder *this_00;
  
  uVar2 = 0;
  num_bits = 0x600;
  this_00 = in_RDI;
  while ((0 < num_bits && (uVar1 = get_char(this_00), uVar1 != 0xff))) {
    num_bits = num_bits + -1;
  }
  status = (jpgd_status)((ulong)in_RDI >> 0x20);
  if (num_bits == 0) {
    stop_decoding((jpeg_decoder *)(ulong)uVar2,status);
  }
  while ((0 < num_bits && (uVar2 = get_char(this_00), uVar2 == 0xff))) {
    num_bits = num_bits + -1;
  }
  if (num_bits != 0) {
    if (uVar2 == in_RDI->m_next_restart_num + 0xd0U) {
      memset(in_RDI->m_last_dc_val,0,(long)in_RDI->m_comps_in_frame << 2);
      in_RDI->m_eob_run = 0;
      in_RDI->m_restarts_left = in_RDI->m_restart_interval;
      in_RDI->m_next_restart_num = in_RDI->m_next_restart_num + 1U & 7;
      in_RDI->m_bits_left = 0x10;
      get_bits_no_markers(this_00,num_bits);
      get_bits_no_markers(this_00,num_bits);
      return;
    }
    stop_decoding((jpeg_decoder *)CONCAT44(num_bits,uVar2),status);
  }
  stop_decoding((jpeg_decoder *)(ulong)uVar2,status);
}

Assistant:

void jpeg_decoder::process_restart() {
  int i;
  int c = 0;

  // Align to a byte boundry
  // FIXME: Is this really necessary? get_bits_no_markers() never reads in markers!
  //get_bits_no_markers(m_bits_left & 7);

  // Let's scan a little bit to find the marker, but not _too_ far.
  // 1536 is a "fudge factor" that determines how much to scan.
  for (i = 1536; i > 0; i--)
    if (get_char() == 0xFF)
      break;

  if (i == 0)
    stop_decoding(JPGD_BAD_RESTART_MARKER);

  for (; i > 0; i--)
    if ((c = get_char()) != 0xFF)
      break;

  if (i == 0)
    stop_decoding(JPGD_BAD_RESTART_MARKER);

  // Is it the expected marker? If not, something bad happened.
  if (c != (m_next_restart_num + M_RST0))
    stop_decoding(JPGD_BAD_RESTART_MARKER);

  // Reset each component's DC prediction values.
  memset(&m_last_dc_val, 0, m_comps_in_frame * sizeof(uint));

  m_eob_run = 0;

  m_restarts_left = m_restart_interval;

  m_next_restart_num = (m_next_restart_num + 1) & 7;

  // Get the bit buffer going again...

  m_bits_left = 16;
  get_bits_no_markers(16);
  get_bits_no_markers(16);
}